

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O0

void __thiscall
ValidationSignals::UpdatedBlockTip
          (ValidationSignals *this,CBlockIndex *pindexNew,CBlockIndex *pindexFork,
          bool fInitialDownload)

{
  string_view source_file;
  bool bVar1;
  pointer pTVar2;
  byte in_CL;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  bool *in_stack_00000008;
  char *local_name;
  anon_class_32_4_f6e2868d_for_event event;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  base_blob<256U> *in_stack_fffffffffffffe40;
  CBlockIndex *in_stack_fffffffffffffe48;
  anon_class_64_5_34d19915 *in_stack_fffffffffffffe50;
  function<void_()> *in_stack_fffffffffffffe58;
  allocator<char> *in_stack_fffffffffffffe78;
  undefined1 *puVar3;
  allocator<char> *__s;
  char *flag;
  int source_line;
  ConstevalFormatString<4U> in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  string_view in_stack_ffffffffffffff00;
  allocator<char> local_d9 [33];
  char *local_b8;
  byte local_a0;
  byte local_89;
  function<void_()> local_68 [2];
  Level in_stack_ffffffffffffffe0;
  char **in_stack_fffffffffffffff0;
  CBlockIndex *args_1;
  
  args_1 = *(CBlockIndex **)(in_FS_OFFSET + 0x28);
  local_a0 = in_CL & 1;
  local_b8 = "UpdatedBlockTip";
  local_89 = local_a0;
  bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe58,
               (char *)in_stack_fffffffffffffe50);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe58,
               (char *)in_stack_fffffffffffffe50);
    flag = "Enqueuing %s: new block hash=%s fork block hash=%s (in IBD=%s)\n";
    CBlockIndex::GetBlockHash(in_stack_fffffffffffffe48);
    base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffe40);
    bVar1 = in_RDX == 0;
    if (bVar1) {
      __s = local_d9;
      std::allocator<char>::allocator();
      source_line = (int)((ulong)in_RDX >> 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                (in_RDI,(char *)__s,in_stack_fffffffffffffe78);
    }
    else {
      CBlockIndex::GetBlockHash(in_stack_fffffffffffffe48);
      source_line = (int)((ulong)in_RDX >> 0x20);
      base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffe40);
    }
    in_stack_fffffffffffffe58 = local_68;
    in_stack_fffffffffffffe50 = (anon_class_64_5_34d19915 *)&stack0xffffffffffffffd8;
    in_stack_fffffffffffffe38 = 1;
    source_file._M_str = in_stack_fffffffffffffef8;
    source_file._M_len = in_stack_fffffffffffffef0;
    LogPrintFormatInternal<char_const*,std::__cxx11::string,std::__cxx11::string,bool>
              (in_stack_ffffffffffffff00,source_file,source_line,(LogFlags)flag,
               in_stack_ffffffffffffffe0,in_stack_fffffffffffffee8,in_stack_fffffffffffffff0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
               unaff_retaddr,in_stack_00000008);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    if (bVar1) {
      std::allocator<char>::~allocator(local_d9);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  std::unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>::operator->
            ((unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  pTVar2 = std::
           unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>::
           operator->((unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                       *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  puVar3 = &stack0xffffffffffffff00;
  std::function<void()>::
  function<ValidationSignals::UpdatedBlockTip(CBlockIndex_const*,CBlockIndex_const*,bool)::__0,void>
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  (*pTVar2->_vptr_TaskRunnerInterface[2])(pTVar2,puVar3);
  std::function<void_()>::~function
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  if (*(CBlockIndex **)(in_FS_OFFSET + 0x28) != args_1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ValidationSignals::UpdatedBlockTip(const CBlockIndex *pindexNew, const CBlockIndex *pindexFork, bool fInitialDownload) {
    // Dependencies exist that require UpdatedBlockTip events to be delivered in the order in which
    // the chain actually updates. One way to ensure this is for the caller to invoke this signal
    // in the same critical section where the chain is updated

    auto event = [pindexNew, pindexFork, fInitialDownload, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.UpdatedBlockTip(pindexNew, pindexFork, fInitialDownload); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: new block hash=%s fork block hash=%s (in IBD=%s)", __func__,
                          pindexNew->GetBlockHash().ToString(),
                          pindexFork ? pindexFork->GetBlockHash().ToString() : "null",
                          fInitialDownload);
}